

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O3

void uv__async_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  void **ppvVar1;
  long *plVar2;
  long lVar3;
  undefined8 *puVar4;
  int iVar5;
  QUEUE *q;
  ssize_t sVar6;
  int *piVar7;
  QUEUE queue;
  char buf [1024];
  long *local_438;
  void *local_430;
  undefined1 local_428 [1032];
  
  if (&loop->async_io_watcher != w) {
    __assert_fail("w == &loop->async_io_watcher",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/async.c"
                  ,0x74,"void uv__async_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  do {
    do {
      sVar6 = read(w->fd,local_428,0x400);
    } while (sVar6 == 0x400);
    if (sVar6 != -1) goto LAB_0017e3d4;
    piVar7 = __errno_location();
  } while (*piVar7 == 4);
  if (*piVar7 != 0xb) {
    abort();
  }
LAB_0017e3d4:
  ppvVar1 = loop->async_handles;
  local_438 = (long *)loop->async_handles[0];
  if (ppvVar1 != (void **)local_438) {
    local_430 = loop->async_handles[1];
    *(long ***)local_430 = &local_438;
    plVar2 = (long *)local_438[1];
    loop->async_handles[1] = plVar2;
    *plVar2 = (long)ppvVar1;
    local_438[1] = (long)&local_438;
    if (&local_438 != (long **)local_438) {
      do {
        lVar3 = *local_438;
        *(long *)local_438[1] = lVar3;
        *(long *)(lVar3 + 8) = local_438[1];
        *local_438 = (long)ppvVar1;
        puVar4 = (undefined8 *)loop->async_handles[1];
        local_438[1] = (long)puVar4;
        *puVar4 = local_438;
        loop->async_handles[1] = local_438;
        LOCK();
        iVar5 = (int)local_438[2];
        if (iVar5 == 2) {
          *(undefined4 *)(local_438 + 2) = 0;
          iVar5 = 2;
        }
        UNLOCK();
        while (iVar5 == 1) {
          LOCK();
          iVar5 = (int)local_438[2];
          if (iVar5 == 2) {
            *(undefined4 *)(local_438 + 2) = 0;
            iVar5 = 2;
          }
          UNLOCK();
        }
        if ((iVar5 != 0) && ((code *)local_438[-1] != (code *)0x0)) {
          (*(code *)local_438[-1])(local_438 + -0xd);
        }
      } while (&local_438 != (long **)local_438);
    }
  }
  return;
}

Assistant:

static void uv__async_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  char buf[1024];
  ssize_t r;
  QUEUE queue;
  QUEUE* q;
  uv_async_t* h;

  assert(w == &loop->async_io_watcher);

  for (;;) {
    r = read(w->fd, buf, sizeof(buf));

    if (r == sizeof(buf))
      continue;

    if (r != -1)
      break;

    if (errno == EAGAIN || errno == EWOULDBLOCK)
      break;

    if (errno == EINTR)
      continue;

    abort();
  }

  QUEUE_MOVE(&loop->async_handles, &queue);
  while (!QUEUE_EMPTY(&queue)) {
    q = QUEUE_HEAD(&queue);
    h = QUEUE_DATA(q, uv_async_t, queue);

    QUEUE_REMOVE(q);
    QUEUE_INSERT_TAIL(&loop->async_handles, q);

    if (0 == uv__async_spin(h))
      continue;  /* Not pending. */

    if (h->async_cb == NULL)
      continue;

    h->async_cb(h);
  }
}